

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeReturn(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Type type_00;
  Return *pRVar2;
  Expression *local_40;
  Type local_20;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_20 = Function::getResults(this->funcContext->func);
  bVar1 = Type::isConcrete(&local_20);
  if (bVar1) {
    type_00 = Function::getResults(this->funcContext->func);
    local_40 = make(this,type_00);
  }
  else {
    local_40 = (Expression *)0x0;
  }
  pRVar2 = Builder::makeReturn(&this->builder,local_40);
  return (Expression *)pRVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeReturn(Type type) {
  return builder.makeReturn(funcContext->func->getResults().isConcrete()
                              ? make(funcContext->func->getResults())
                              : nullptr);
}